

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  double dVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  lua_Number lVar9;
  
  if (((l->tt_ & 0xf) != 3) || (bVar2 = r->tt_, (bVar2 & 0xf) != 3)) {
    if (((l->tt_ & 0xf) == 4) && ((r->tt_ & 0xf) == 4)) {
      uVar4 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
      return uVar4 >> 0x1f;
    }
    iVar5 = luaT_callorderTM(L,l,r,TM_LT);
    return iVar5;
  }
  if (l->tt_ == 3) {
    lVar3 = (l->value_).i;
    if (bVar2 == 3) {
      bVar6 = lVar3 < (r->value_).i;
      goto LAB_0011e164;
    }
    dVar1 = (r->value_).n;
    if (0x40000000000000 < lVar3 + 0x20000000000000U) {
      dVar8 = floor(dVar1);
      dVar8 = (double)(~-(ulong)(dVar8 != dVar1) & (ulong)dVar8 |
                      (ulong)(dVar8 + 1.0) & -(ulong)(dVar8 != dVar1));
      bVar7 = 0.0 < dVar1;
      bVar6 = lVar3 < (long)dVar8;
      if (9.223372036854776e+18 <= dVar8) {
        bVar6 = bVar7;
      }
LAB_0011e161:
      if (dVar8 < -9.223372036854776e+18) {
        bVar6 = bVar7;
      }
      goto LAB_0011e164;
    }
    bVar7 = dVar1 == (double)lVar3;
    bVar6 = dVar1 < (double)lVar3;
  }
  else {
    dVar1 = (l->value_).n;
    if (bVar2 == 0x13) {
      lVar9 = (r->value_).n;
    }
    else {
      lVar3 = (r->value_).i;
      if (0x40000000000000 < lVar3 + 0x20000000000000U) {
        dVar8 = floor(dVar1);
        bVar7 = dVar1 < 0.0;
        bVar6 = (long)dVar8 < lVar3;
        if (9.223372036854776e+18 <= dVar8) {
          bVar6 = bVar7;
        }
        goto LAB_0011e161;
      }
      lVar9 = (lua_Number)lVar3;
    }
    bVar7 = lVar9 == dVar1;
    bVar6 = lVar9 < dVar1;
  }
  bVar6 = !bVar6 && !bVar7;
LAB_0011e164:
  return (int)bVar6;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LTnum(l, r);
  else return lessthanothers(L, l, r);
}